

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_interface.c
# Opt level: O1

int CMwrite_attr(CMConnection conn,CMFormat format,void *data,attr_list attrs)

{
  CManager cm;
  int iVar1;
  
  cm = conn->cm;
  IntCManager_lock(cm,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/build_O1/thirdparty/EVPath/EVPath/cm_interface.c"
                   ,0x281);
  iVar1 = INT_CMwrite_attr(conn,format,data,attrs);
  IntCManager_unlock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/build_O1/thirdparty/EVPath/EVPath/cm_interface.c"
                     ,0x283);
  return iVar1;
}

Assistant:

extern int
CMwrite_attr ( CMConnection conn, CMFormat format, void *data, attr_list attrs )
{
	int ret;
	CManager cm = conn->cm;
	CManager_lock(cm);
	ret = INT_CMwrite_attr(conn, format, data, attrs);
	CManager_unlock(cm);
	return ret;
}